

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

bool anon_unknown.dwarf_775ed::parse_internal
               (int argc,char **argv,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *unparsed_args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  Node *pNVar10;
  ostream *poVar11;
  long *plVar12;
  iterator iVar13;
  long lVar14;
  _Rb_tree_node_base *p_Var15;
  Logger *pLVar16;
  size_t sVar17;
  pointer pbVar18;
  size_type *psVar19;
  _Rb_tree_node_base *p_Var20;
  ulong uVar21;
  string config_filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parsed_arg;
  string program_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  matches;
  string local_c8;
  undefined1 local_a8 [24];
  long lStack_90;
  string local_88;
  undefined1 local_68 [32];
  char **local_48;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_40;
  ulong local_38;
  
  (anonymous_namespace)::geo_argc = argc;
  (anonymous_namespace)::geo_argv = argv;
  local_40 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)unparsed_args;
  if (argc < 1) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88.field_2._M_allocated_capacity = 0x203d3e2063677261;
    local_88.field_2._8_2_ = 0x31;
    local_88._M_string_length = 9;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
               ,"");
    GEO::geo_assertion_failed(&local_88,&local_c8,0x966);
  }
  std::__cxx11::string::string((string *)local_a8,*argv,(allocator *)local_68);
  pNVar10 = GEO::SmartPointer<GEO::FileSystem::Node>::operator->
                      ((SmartPointer<GEO::FileSystem::Node> *)&(anonymous_namespace)::root_);
  (*(pNVar10->super_Counted)._vptr_Counted[0x13])(&local_c8,pNVar10,local_a8,1);
  GEO::String::to_uppercase(&local_88,&local_c8);
  paVar1 = &local_c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  pbVar2 = (pointer)(local_a8 + 0x10);
  if ((pointer)local_a8._0_8_ != pbVar2) {
    operator_delete((void *)local_a8._0_8_);
  }
  if ((anonymous_namespace)::parse_config_file(int,char**)::init == '\0') {
    (anonymous_namespace)::parse_config_file(int,char**)::init = '\x01';
    local_c8._M_string_length = 6;
    local_c8.field_2._M_allocated_capacity._0_7_ = 0x6769666e6f63;
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    poVar11 = GEO::Logger::out(&local_c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Configuration file name:",0x18);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(anonymous_namespace)::config_file_name_abi_cxx11_,DAT_001abb58);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    local_c8._M_string_length = 6;
    local_c8.field_2._M_allocated_capacity._0_7_ = 0x6769666e6f63;
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    poVar11 = GEO::Logger::out(&local_c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Home directory:",0xf);
    pNVar10 = GEO::SmartPointer<GEO::FileSystem::Node>::operator->
                        ((SmartPointer<GEO::FileSystem::Node> *)&(anonymous_namespace)::root_);
    (*(pNVar10->super_Counted)._vptr_Counted[0xf])(local_a8,pNVar10);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(char *)local_a8._0_8_,local_a8._8_8_);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    if ((pointer)local_a8._0_8_ != pbVar2) {
      operator_delete((void *)local_a8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    pNVar10 = GEO::SmartPointer<GEO::FileSystem::Node>::operator->
                        ((SmartPointer<GEO::FileSystem::Node> *)&(anonymous_namespace)::root_);
    (*(pNVar10->super_Counted)._vptr_Counted[0xf])(local_68,pNVar10);
    plVar12 = (long *)std::__cxx11::string::append(local_68);
    pbVar18 = (pointer)(plVar12 + 2);
    if ((pointer)*plVar12 == pbVar18) {
      local_a8._16_8_ = (pbVar18->_M_dataplus)._M_p;
      lStack_90 = plVar12[3];
      local_a8._0_8_ = pbVar2;
    }
    else {
      local_a8._16_8_ = (pbVar18->_M_dataplus)._M_p;
      local_a8._0_8_ = (pointer)*plVar12;
    }
    local_a8._8_8_ = plVar12[1];
    *plVar12 = (long)pbVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append
                                (local_a8,(ulong)(anonymous_namespace)::config_file_name_abi_cxx11_)
    ;
    psVar19 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar19) {
      local_c8.field_2._M_allocated_capacity = *psVar19;
      local_c8.field_2._8_8_ = plVar12[3];
      local_c8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar19;
      local_c8._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_c8._M_string_length = plVar12[1];
    *plVar12 = (long)psVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    if ((pointer)local_a8._0_8_ != pbVar2) {
      operator_delete((void *)local_a8._0_8_);
    }
    if ((string *)local_68._0_8_ != (string *)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_);
    }
    parse_config_file(&local_c8,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  uVar21 = (anonymous_namespace)::desc_;
  pcVar3 = *argv;
  pcVar4 = *(char **)((anonymous_namespace)::desc_ + 8);
  strlen(pcVar3);
  std::__cxx11::string::_M_replace(uVar21,0,pcVar4,(ulong)pcVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_40);
  bVar8 = true;
  if (argc != 1) {
    local_38 = (ulong)(uint)argc;
    bVar8 = true;
    uVar21 = 1;
    local_48 = argv;
    do {
      local_a8._0_8_ = (key_type *)0x0;
      local_a8._8_8_ = (pointer)0x0;
      local_a8._16_8_ = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_88,argv[uVar21],(allocator *)&local_c8);
      paVar1 = &local_88.field_2;
      GEO::String::split_string
                (&local_88,'=',
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      uVar6 = local_a8._0_8_;
      if (local_a8._8_8_ - local_a8._0_8_ == 0x40) {
        local_88._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"dbg:","");
        iVar9 = std::__cxx11::string::compare(uVar6,0,(string *)local_88._M_string_length);
        if (iVar9 == 0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p);
          }
        }
        else {
          iVar13 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
                   ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
                           *)((anonymous_namespace)::desc_ + 0x20),(key_type *)local_a8._0_8_);
          uVar5 = (anonymous_namespace)::desc_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          if (iVar13._M_node == (_Base_ptr)(uVar5 + 0x28)) {
            local_68._0_8_ = (string *)0x0;
            local_68._8_8_ = (pointer)0x0;
            local_68._16_8_ = (pointer)0x0;
            p_Var20 = (_Rb_tree_node_base *)((anonymous_namespace)::desc_ + 0x28);
            p_Var15 = *(_Rb_tree_node_base **)((anonymous_namespace)::desc_ + 0x38);
            argv = local_48;
            while (local_48 = argv, p_Var15 != p_Var20) {
              lVar14 = std::__cxx11::string::find
                                 ((char *)(p_Var15 + 1),
                                  (ulong)(((key_type *)local_a8._0_8_)->_M_dataplus)._M_p,0);
              if (lVar14 != -1) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_68,(value_type *)(p_Var15 + 1));
              }
              p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
              argv = local_48;
            }
            paVar1 = &local_88.field_2;
            if (local_68._8_8_ - local_68._0_8_ == 0x20) {
              bVar7 = GEO::CmdLine::set_arg
                                ((string *)local_68._0_8_,(string *)(local_a8._0_8_ + 0x20));
              bVar8 = (bool)(bVar7 & bVar8);
            }
            else {
              if ((ulong)(local_68._8_8_ - local_68._0_8_) < 0x21) {
                pLVar16 = GEO::Logger::instance();
                pLVar16->quiet_ = false;
                local_88._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CmdLine","");
                poVar11 = GEO::Logger::err(&local_88);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"Invalid argument: ",0x12);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,((_Alloc_hider *)local_a8._0_8_)->_M_p,
                                     *(size_type *)(local_a8._0_8_ + 8));
                std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
              }
              else {
                pLVar16 = GEO::Logger::instance();
                pLVar16->quiet_ = false;
                local_88._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CmdLine","");
                poVar11 = GEO::Logger::err(&local_88);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"Argument is ambiguous: ",0x17);
                pcVar3 = argv[uVar21];
                if (pcVar3 == (char *)0x0) {
                  std::ios::clear((int)poVar11 + (int)poVar11->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar17 = strlen(pcVar3);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar3,sVar17);
                }
                std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                std::ostream::put((char)poVar11);
                poVar11 = (ostream *)std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"Possible matches: ",0x12);
                GEO::String::join_strings
                          (&local_c8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_68,' ');
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,local_c8._M_dataplus._M_p,local_c8._M_string_length);
                std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != paVar1) {
                operator_delete(local_88._M_dataplus._M_p);
              }
              bVar8 = false;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_68);
            goto LAB_0012fb41;
          }
        }
        bVar7 = GEO::CmdLine::set_arg((string *)local_a8._0_8_,(string *)(local_a8._0_8_ + 0x20));
        bVar8 = (bool)(bVar7 & bVar8);
        argv = local_48;
      }
      else {
        std::__cxx11::string::string((string *)&local_88,argv[uVar21],(allocator *)&local_c8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_40,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p);
        }
      }
LAB_0012fb41:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8);
      uVar21 = uVar21 + 1;
    } while (uVar21 != local_38);
  }
  return bVar8;
}

Assistant:

bool parse_internal(
        int argc, char** argv, std::vector<std::string>& unparsed_args
    ) {
	geo_argc = argc;
	geo_argv = argv;
	
	parse_config_file(argc, argv);
	
        bool ok = true;
        desc_->argv0 = argv[0];
        unparsed_args.clear();

        for(int i = 1; i < argc; i++) {
            std::vector<std::string> parsed_arg;
            String::split_string(argv[i], '=', parsed_arg);
            if(parsed_arg.size() != 2) {
                unparsed_args.push_back(argv[i]);
            } else {
                if(
                    String::string_starts_with(parsed_arg[0], "dbg:") ||
                    desc_->args.find(parsed_arg[0]) != desc_->args.end()
                ) {
                    if(!set_arg(parsed_arg[0], parsed_arg[1])) {
                        ok = false;
                    }
                } else {

                    std::vector<std::string> matches;
                    for( auto& it : desc_->args) {
                        if(arg_matches(parsed_arg[0], it.first)) {
                            matches.push_back(it.first);
                        }
                    }

                    if(matches.size() == 1) {
                        if(!set_arg(matches[0], parsed_arg[1])) {
                            ok = false;
                        }
                    } else if(matches.size() >= 2) {
                        ok = false;
                        Logger::instance()->set_quiet(false);
                        Logger::err("CmdLine")
                            << "Argument is ambiguous: " << argv[i]
                            << std::endl
                            << "Possible matches: "
                            << String::join_strings(matches, ' ')
                            << std::endl;
                    } else {
                        ok = false;
                        Logger::instance()->set_quiet(false);
                        Logger::err("CmdLine")
                            << "Invalid argument: " << parsed_arg[0]
                            << std::endl;
                    }
                }
            }
        }
        return ok;
    }